

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *c1,Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                    *c2)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  Column_support *this;
  node_ptr plVar4;
  node_ptr plVar5;
  Column_support *this_00;
  
  if (c1 != c2) {
    plVar4 = (c1->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    this_00 = &c1->column_;
    plVar5 = (c2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    this = &c2->column_;
    sVar2 = boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
            ::size(&this_00->super_type);
    sVar3 = boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
            ::size(&this->super_type);
    if (sVar2 == sVar3) {
      for (; ((bVar1 = plVar5 == (node_ptr)this || plVar4 == (node_ptr)this_00,
              plVar5 != (node_ptr)this && plVar4 != (node_ptr)this_00 &&
              (*(int *)&plVar4[1].next_ == *(int *)&plVar5[1].next_)) &&
             (*(int *)((long)(plVar4 + 0xffffffffffffffff) + 8) ==
              *(int *)((long)(plVar5 + 0xffffffffffffffff) + 8))); plVar4 = plVar4->next_) {
        plVar5 = plVar5->next_;
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return true;
}

Assistant:

bool operator==(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return true;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ == c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      if (c1.column_.size() != c2.column_.size()) return false;
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index() || it1->get_element() != it2->get_element()) return false;
        ++it1;
        ++it2;
      }
      return true;
    }
  }